

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall SFFile::SetOrder(SFFile *this,int order,int drum,int bank,int program)

{
  uint uVar1;
  SFPerc *pSVar2;
  SFPreset *pSVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = this->NumPresets;
  uVar4 = (ulong)uVar1;
  if (drum == 0) {
    if (0 < (int)uVar1) {
      lVar5 = 0x15;
      lVar6 = 0;
      do {
        pSVar3 = this->Presets;
        if (((uint)*(ushort *)(pSVar3->Name + lVar5 + 1) == program) &&
           ((uint)*(ushort *)(pSVar3->Name + lVar5 + 3) == bank)) {
          pSVar3->Name[lVar5] = pSVar3->Name[lVar5] & 0x80U | (byte)order & 0x7f;
          uVar4 = (ulong)(uint)this->NumPresets;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x1c;
      } while (lVar6 < (int)uVar4);
    }
  }
  else if (0 < (int)uVar1) {
    pSVar2 = (this->Percussion).Array;
    lVar5 = 0;
    do {
      if (((uint)*(byte *)((long)&(pSVar2->Generators).field_0 + lVar5) == bank) &&
         ((uint)*(byte *)((long)&(pSVar2->Generators).field_0 + lVar5 + 1) == program)) {
        (&pSVar2->LoadOrder)[lVar5] = (byte)order;
      }
      lVar5 = lVar5 + 0x70;
    } while (uVar4 * 0x70 - lVar5 != 0);
  }
  return;
}

Assistant:

void SFFile::SetOrder(int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Percussion[i].Generators.drumset == bank && Percussion[i].Generators.key == program)
			{
				Percussion[i].LoadOrder = order;
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Presets[i].Program == program && Presets[i].Bank == bank)
			{
				Presets[i].LoadOrder = order;
			}
		}
	}
}